

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O2

void __thiscall
dlib::
array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
::swap(array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
       *this,array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
             *item)

{
  bool bVar1;
  member_function_pointer<void,_void,_void,_void> *pmVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  
  pmVar2 = item->array_elements;
  uVar3 = this->array_size;
  uVar4 = this->max_array_size;
  item->array_elements = this->array_elements;
  uVar5 = item->array_size;
  uVar6 = item->max_array_size;
  item->array_size = uVar3;
  item->max_array_size = uVar4;
  this->array_size = uVar5;
  this->max_array_size = uVar6;
  this->array_elements = pmVar2;
  bVar1 = this->_at_start;
  this->_at_start = item->_at_start;
  item->_at_start = bVar1;
  pmVar2 = this->pos;
  this->pos = item->pos;
  item->pos = pmVar2;
  pmVar2 = this->last_pos;
  this->last_pos = item->last_pos;
  item->last_pos = pmVar2;
  return;
}

Assistant:

void array<T,mem_manager>::
    swap (
        array<T,mem_manager>& item
    )
    {
        unsigned long    array_size_temp        = item.array_size;
        unsigned long    max_array_size_temp    = item.max_array_size;
        T*               array_elements_temp    = item.array_elements;

        item.array_size         = array_size;
        item.max_array_size     = max_array_size;
        item.array_elements     = array_elements;

        array_size        = array_size_temp;
        max_array_size    = max_array_size_temp;
        array_elements    = array_elements_temp;

        exchange(_at_start,item._at_start);
        exchange(pos,item.pos);
        exchange(last_pos,item.last_pos);
        pool.swap(item.pool);
    }